

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# art_key.cpp
# Opt level: O1

bool __thiscall duckdb::ARTKey::operator>=(ARTKey *this,ARTKey *key)

{
  data_ptr_t *ppdVar1;
  ulong uVar2;
  ulong uVar3;
  byte bVar4;
  ulong uVar5;
  ulong uVar6;
  byte bVar7;
  bool bVar8;
  
  uVar2 = this->len;
  uVar3 = key->len;
  uVar5 = uVar3;
  if (uVar2 < uVar3) {
    uVar5 = uVar2;
  }
  bVar8 = uVar5 != 0;
  if (bVar8) {
    ppdVar1 = &key->data;
    bVar7 = *this->data;
    bVar4 = **ppdVar1;
    key = (ARTKey *)&DAT_00000001;
    if (bVar7 <= bVar4) {
      uVar6 = 1;
      do {
        if (bVar7 < bVar4) {
          key = (ARTKey *)0x0;
          break;
        }
        bVar8 = uVar6 < uVar5;
        if (uVar6 == uVar5) break;
        bVar7 = this->data[uVar6];
        bVar4 = (*ppdVar1)[uVar6];
        uVar6 = uVar6 + 1;
      } while (bVar7 <= bVar4);
    }
  }
  bVar7 = (byte)key;
  if (!bVar8) {
    bVar7 = uVar3 <= uVar2;
  }
  return (bool)(bVar7 & 1);
}

Assistant:

bool ARTKey::operator>=(const ARTKey &key) const {
	for (idx_t i = 0; i < MinValue(len, key.len); i++) {
		if (data[i] > key.data[i]) {
			return true;
		} else if (data[i] < key.data[i]) {
			return false;
		}
	}
	return len >= key.len;
}